

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O2

int parsedate(char *date,time_t *output)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  int *piVar8;
  long lVar9;
  int i;
  int iVar10;
  long lVar11;
  uint uVar12;
  char *pcVar13;
  char **what;
  char **ppcVar14;
  long lVar15;
  char *pcVar16;
  long lVar17;
  bool bVar18;
  int local_90;
  int local_8c;
  int local_84;
  uint local_80;
  int local_7c;
  int len;
  int minnum;
  int hournum;
  int local_6c;
  char buf [32];
  
  hournum = -1;
  minnum = -1;
  local_84 = -1;
  local_90 = -1;
  local_80 = 0;
  uVar12 = 0;
  iVar10 = -1;
  lVar11 = 0xffffffff;
  pcVar13 = date;
  local_8c = local_90;
  local_7c = local_90;
  do {
    if ((*pcVar13 == '\0') || (5 < uVar12)) {
      if (local_84 == -1) {
        hournum = 0;
        minnum = 0;
        local_84 = 0;
      }
      iVar5 = -1;
      if ((((local_7c != -1) && (iVar10 != -1)) && (0x62e < local_8c)) &&
         ((local_84 < 0x3d && minnum < 0x3c) &&
          (hournum < 0x18 && (iVar10 < 0xc && local_7c < 0x20)))) {
        uVar12 = local_8c - (uint)(iVar10 < 2);
        iVar5 = 0;
        if (local_90 == -1) {
          local_90 = iVar5;
        }
        *output = ((((long)local_7c + (long)(local_8c + -0x7b2) * 0x16d +
                     (long)*(int *)(time2epoch_month_days_cumulative + (long)iVar10 * 4) +
                    (long)(int)(uVar12 / 400 + ((uVar12 >> 2) - uVar12 / 100) + -0x1dd)) * 0x18 +
                   (long)hournum) * 0x3c + (long)minnum) * 0x3c + (long)local_90 + (long)local_84 +
                  -0x15180;
      }
      return iVar5;
    }
    lVar17 = 0;
    do {
      lVar15 = lVar17;
      bVar1 = pcVar13[lVar15];
      lVar17 = lVar15 + 1;
      if ((0xe5 < (byte)((bVar1 & 0xdf) + 0xa5)) || (bVar1 == 0)) break;
    } while ((byte)(bVar1 - 0x3a) < 0xf6);
    pcVar16 = pcVar13 + lVar15;
    if ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a) {
      buf[0x10] = '\0';
      buf[0x11] = '\0';
      buf[0x12] = '\0';
      buf[0x13] = '\0';
      buf[0x14] = '\0';
      buf[0x15] = '\0';
      buf[0x16] = '\0';
      buf[0x17] = '\0';
      buf[0x18] = '\0';
      buf[0x19] = '\0';
      buf[0x1a] = '\0';
      buf[0x1b] = '\0';
      buf[0x1c] = '\0';
      buf[0x1d] = '\0';
      buf[0x1e] = '\0';
      buf[0x1f] = '\0';
      buf[0] = '\0';
      buf[1] = '\0';
      buf[2] = '\0';
      buf[3] = '\0';
      buf[4] = '\0';
      buf[5] = '\0';
      buf[6] = '\0';
      buf[7] = '\0';
      buf[8] = '\0';
      buf[9] = '\0';
      buf[10] = '\0';
      buf[0xb] = '\0';
      buf[0xc] = '\0';
      buf[0xd] = '\0';
      buf[0xe] = '\0';
      buf[0xf] = '\0';
      iVar5 = __isoc99_sscanf(pcVar16,"%31[ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz]",
                              buf);
      if (iVar5 == 0) {
        sVar7 = 0;
      }
      else {
        sVar7 = strlen(buf);
      }
      if ((int)lVar11 == -1) {
        ppcVar14 = Curl_wkday;
        if (3 < sVar7) {
          ppcVar14 = weekday;
        }
        for (lVar11 = 0; (int)lVar11 != 7; lVar11 = lVar11 + 1) {
          iVar5 = Curl_strcasecompare(buf,ppcVar14[lVar11]);
          if (iVar5 != 0) goto LAB_004c912f;
        }
        lVar11 = 0xffffffff;
      }
      if (iVar10 == -1) {
        ppcVar14 = Curl_month;
        for (iVar10 = 0; iVar10 != 0xc; iVar10 = iVar10 + 1) {
          iVar5 = Curl_strcasecompare(buf,*ppcVar14);
          if (iVar5 != 0) goto LAB_004c912f;
          ppcVar14 = ppcVar14 + 1;
        }
        iVar10 = -1;
      }
      if (local_90 != -1) {
        return -1;
      }
      lVar15 = 0;
      while( true ) {
        if ((int)lVar15 == 0x33c) {
          return -1;
        }
        iVar5 = Curl_strcasecompare(buf,tz[0].name + lVar15);
        if (iVar5 != 0) break;
        lVar15 = lVar15 + 0xc;
      }
      local_90 = *(int *)(tz[0].name + lVar15 + 8) * 0x3c;
LAB_004c912f:
      pcVar16 = pcVar13 + lVar17 + sVar7 + -1;
    }
    else if ((byte)(bVar1 - 0x30) < 10) {
      len = 0;
      if (local_84 == -1) {
        iVar5 = __isoc99_sscanf(pcVar16,"%02d:%02d:%02d%n",&hournum,&minnum,&local_84,&len);
        if (iVar5 == 3) {
          pcVar16 = pcVar13 + lVar17 + len + -1;
        }
        else {
          if ((local_84 != -1) ||
             (iVar5 = __isoc99_sscanf(pcVar16,"%02d:%02d%n",&hournum,&minnum,&len), iVar5 != 2))
          goto LAB_004c8f2e;
          local_84 = 0;
          pcVar16 = pcVar13 + lVar17 + len + -1;
        }
      }
      else {
LAB_004c8f2e:
        local_6c = iVar10;
        piVar8 = __errno_location();
        iVar5 = *piVar8;
        *piVar8 = 0;
        lVar9 = strtol(pcVar16,(char **)buf,10);
        iVar10 = local_6c;
        iVar6 = *piVar8;
        if (iVar6 != iVar5) {
          *piVar8 = iVar5;
        }
        if (iVar6 != 0) {
          return -1;
        }
        if (lVar9 - 0x80000000U < 0xffffffff00000000) {
          return -1;
        }
        iVar5 = curlx_sltosi(lVar9);
        lVar9 = ((buf._0_8_ - (long)pcVar13) - lVar17) + 1;
        if (local_90 == -1) {
          bVar3 = false;
          if ((date < pcVar16) && ((buf._0_8_ - (long)pcVar13) + -3 == lVar17)) {
            local_90 = -1;
            if (iVar5 < 0x579) {
              cVar2 = pcVar13[lVar15 + -1];
              if ((cVar2 != '-') && (cVar2 != '+')) {
                lVar9 = 4;
                goto LAB_004c9199;
              }
              iVar6 = (iVar5 / 100) * 0x3c + iVar5 % 100;
              local_90 = iVar6 * -0x3c;
              if (cVar2 != '+') {
                local_90 = iVar6 * 0x3c;
              }
              bVar3 = true;
              lVar9 = 4;
            }
          }
          else {
LAB_004c9199:
            bVar3 = false;
            local_90 = -1;
          }
        }
        else {
          bVar3 = false;
        }
        if ((((lVar9 == 8) && (local_8c == -1)) && (iVar10 == -1)) && (local_7c == -1)) {
          local_8c = iVar5 / 10000;
          iVar10 = (int)(short)((short)((long)iVar5 % 10000) / 100 + -1);
          local_7c = iVar5 % 100;
          bVar3 = true;
        }
        bVar4 = (bool)(local_7c == -1 & local_80 == 0 & ~bVar3);
        bVar18 = iVar5 - 1U < 0x1f;
        iVar6 = -1;
        if (bVar18) {
          iVar6 = iVar5;
        }
        if (bVar4) {
          local_80 = 1;
          local_7c = iVar6;
        }
        bVar18 = (bool)(bVar18 & bVar4);
        pcVar16 = (char *)buf._0_8_;
        if (((bVar18 || bVar3) || (local_80 != 1)) || (local_8c != -1)) {
          if (!bVar18 && !bVar3) {
            return -1;
          }
        }
        else {
          if (iVar5 < 100) {
            if (iVar5 < 0x47) {
              iVar5 = iVar5 + 2000;
            }
            else {
              iVar5 = iVar5 + 0x76c;
            }
          }
          local_80 = (uint)(local_7c != -1);
          local_8c = iVar5;
        }
      }
    }
    pcVar13 = pcVar16;
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

static int parsedate(const char *date, time_t *output)
{
  time_t t = 0;
  int wdaynum = -1;  /* day of the week number, 0-6 (mon-sun) */
  int monnum = -1;   /* month of the year number, 0-11 */
  int mdaynum = -1; /* day of month, 1 - 31 */
  int hournum = -1;
  int minnum = -1;
  int secnum = -1;
  int yearnum = -1;
  int tzoff = -1;
  enum assume dignext = DATE_MDAY;
  const char *indate = date; /* save the original pointer */
  int part = 0; /* max 6 parts */

  while(*date && (part < 6)) {
    bool found = FALSE;

    skip(&date);

    if(ISALPHA(*date)) {
      /* a name coming up */
      char buf[32]="";
      size_t len;
      if(sscanf(date, "%31[ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                          "abcdefghijklmnopqrstuvwxyz]", buf))
        len = strlen(buf);
      else
        len = 0;

      if(wdaynum == -1) {
        wdaynum = checkday(buf, len);
        if(wdaynum != -1)
          found = TRUE;
      }
      if(!found && (monnum == -1)) {
        monnum = checkmonth(buf);
        if(monnum != -1)
          found = TRUE;
      }

      if(!found && (tzoff == -1)) {
        /* this just must be a time zone string */
        tzoff = checktz(buf);
        if(tzoff != -1)
          found = TRUE;
      }

      if(!found)
        return PARSEDATE_FAIL; /* bad string */

      date += len;
    }
    else if(ISDIGIT(*date)) {
      /* a digit */
      int val;
      char *end;
      int len = 0;
      if((secnum == -1) &&
         (3 == sscanf(date, "%02d:%02d:%02d%n",
                      &hournum, &minnum, &secnum, &len))) {
        /* time stamp! */
        date += len;
      }
      else if((secnum == -1) &&
              (2 == sscanf(date, "%02d:%02d%n", &hournum, &minnum, &len))) {
        /* time stamp without seconds */
        date += len;
        secnum = 0;
      }
      else {
        long lval;
        int error;
        int old_errno;

        old_errno = errno;
        errno = 0;
        lval = strtol(date, &end, 10);
        error = errno;
        if(errno != old_errno)
          errno = old_errno;

        if(error)
          return PARSEDATE_FAIL;

#if LONG_MAX != INT_MAX
        if((lval > (long)INT_MAX) || (lval < (long)INT_MIN))
          return PARSEDATE_FAIL;
#endif

        val = curlx_sltosi(lval);

        if((tzoff == -1) &&
           ((end - date) == 4) &&
           (val <= 1400) &&
           (indate< date) &&
           ((date[-1] == '+' || date[-1] == '-'))) {
          /* four digits and a value less than or equal to 1400 (to take into
             account all sorts of funny time zone diffs) and it is preceded
             with a plus or minus. This is a time zone indication.  1400 is
             picked since +1300 is frequently used and +1400 is mentioned as
             an edge number in the document "ISO C 200X Proposal: Timezone
             Functions" at http://david.tribble.com/text/c0xtimezone.html If
             anyone has a more authoritative source for the exact maximum time
             zone offsets, please speak up! */
          found = TRUE;
          tzoff = (val/100 * 60 + val%100)*60;

          /* the + and - prefix indicates the local time compared to GMT,
             this we need their reversed math to get what we want */
          tzoff = date[-1]=='+'?-tzoff:tzoff;
        }

        if(((end - date) == 8) &&
           (yearnum == -1) &&
           (monnum == -1) &&
           (mdaynum == -1)) {
          /* 8 digits, no year, month or day yet. This is YYYYMMDD */
          found = TRUE;
          yearnum = val/10000;
          monnum = (val%10000)/100-1; /* month is 0 - 11 */
          mdaynum = val%100;
        }

        if(!found && (dignext == DATE_MDAY) && (mdaynum == -1)) {
          if((val > 0) && (val<32)) {
            mdaynum = val;
            found = TRUE;
          }
          dignext = DATE_YEAR;
        }

        if(!found && (dignext == DATE_YEAR) && (yearnum == -1)) {
          yearnum = val;
          found = TRUE;
          if(yearnum < 100) {
            if(yearnum > 70)
              yearnum += 1900;
            else
              yearnum += 2000;
          }
          if(mdaynum == -1)
            dignext = DATE_MDAY;
        }

        if(!found)
          return PARSEDATE_FAIL;

        date = end;
      }
    }

    part++;
  }

  if(-1 == secnum)
    secnum = minnum = hournum = 0; /* no time, make it zero */

  if((-1 == mdaynum) ||
     (-1 == monnum) ||
     (-1 == yearnum))
    /* lacks vital info, fail */
    return PARSEDATE_FAIL;

#ifdef HAVE_TIME_T_UNSIGNED
  if(yearnum < 1970) {
    /* only positive numbers cannot return earlier */
    *output = TIME_T_MIN;
    return PARSEDATE_SOONER;
  }
#endif

#if (SIZEOF_TIME_T < 5)

#ifdef HAVE_TIME_T_UNSIGNED
  /* an unsigned 32 bit time_t can only hold dates to 2106 */
  if(yearnum > 2105) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER;
  }
#else
  /* a signed 32 bit time_t can only hold dates to the beginning of 2038 */
  if(yearnum > 2037) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER;
  }
  if(yearnum < 1903) {
    *output = TIME_T_MIN;
    return PARSEDATE_SOONER;
  }
#endif

#else
  /* The Gregorian calendar was introduced 1582 */
  if(yearnum < 1583)
    return PARSEDATE_FAIL;
#endif

  if((mdaynum > 31) || (monnum > 11) ||
     (hournum > 23) || (minnum > 59) || (secnum > 60))
    return PARSEDATE_FAIL; /* clearly an illegal date */

  /* time2epoch() returns a time_t. time_t is often 32 bits, sometimes even on
     architectures that feature 64 bit 'long' but ultimately time_t is the
     correct data type to use.
  */
  t = time2epoch(secnum, minnum, hournum, mdaynum, monnum, yearnum);

  /* Add the time zone diff between local time zone and GMT. */
  if(tzoff == -1)
    tzoff = 0;

  if((tzoff > 0) && (t > TIME_T_MAX - tzoff)) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER; /* time_t overflow */
  }

  t += tzoff;

  *output = t;

  return PARSEDATE_OK;
}